

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O1

void sk_addr_free(SockAddr *addr)

{
  int iVar1;
  
  iVar1 = addr->refcount;
  addr->refcount = iVar1 + -1;
  if (1 < iVar1) {
    return;
  }
  if ((addrinfo *)addr->ais != (addrinfo *)0x0) {
    freeaddrinfo((addrinfo *)addr->ais);
  }
  safefree(addr);
  return;
}

Assistant:

void sk_addr_free(SockAddr *addr)
{
    if (--addr->refcount > 0)
        return;
#ifndef NO_IPV6
    if (addr->ais != NULL)
        freeaddrinfo(addr->ais);
#else
    sfree(addr->addresses);
#endif
    sfree(addr);
}